

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

void __thiscall tst_InsertProxyModel::testCommitSubclass_data(tst_InsertProxyModel *this)

{
  QTestData *pQVar1;
  bool local_3d;
  QFlags<InsertProxyModel::InsertDirection> local_3c;
  QAbstractItemModel *local_38;
  
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QFlags<InsertProxyModel::InsertDirection>>
            ("insertDirection",(QFlags<InsertProxyModel::InsertDirection> *)0x0);
  QTest::addColumnInternal(1,"canInsertColumns");
  pQVar1 = (QTestData *)QTest::newRow("List Row");
  local_38 = createListModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 1;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = false;
  operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("List Column");
  local_38 = createListModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 2;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = false;
  operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("List Row Column");
  local_38 = createListModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 3;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = false;
  operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("Table Row");
  local_38 = createTableModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 1;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = true;
  operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("Table Column");
  local_38 = createTableModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 2;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = true;
  operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("Table Row Column");
  local_38 = createTableModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 3;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = true;
  operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("Tree Row");
  local_38 = createTreeModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 1;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = true;
  operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("Tree Column");
  local_38 = createTreeModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 2;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = true;
  operator<<(pQVar1,&local_3d);
  pQVar1 = (QTestData *)QTest::newRow("Tree Row Column");
  local_38 = createTreeModel(&this->super_QObject);
  pQVar1 = operator<<(pQVar1,&local_38);
  local_3c.i = 3;
  pQVar1 = operator<<(pQVar1,&local_3c);
  local_3d = true;
  operator<<(pQVar1,&local_3d);
  return;
}

Assistant:

void tst_InsertProxyModel::testCommitSubclass_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<InsertProxyModel::InsertDirections>("insertDirection");
    QTest::addColumn<bool>("canInsertColumns");

    QTest::newRow("List Row") << createListModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << false;
    QTest::newRow("List Column") << createListModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << false;
    QTest::newRow("List Row Column") << createListModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << false;
    QTest::newRow("Table Row") << createTableModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << true;
    QTest::newRow("Table Column") << createTableModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Table Row Column") << createTableModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Tree Row") << createTreeModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertRow) << true;
    QTest::newRow("Tree Column") << createTreeModel(this) << InsertProxyModel::InsertDirections(InsertProxyModel::InsertColumn) << true;
    QTest::newRow("Tree Row Column") << createTreeModel(this) << (InsertProxyModel::InsertRow | InsertProxyModel::InsertColumn) << true;
}